

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_seckey_verify(secp256k1_context *ctx,uchar *seckey)

{
  uint uVar1;
  int overflow;
  secp256k1_scalar sec;
  int local_3c;
  secp256k1_scalar local_38;
  
  if (seckey == (uchar *)0x0) {
    secp256k1_ec_seckey_verify_cold_1();
    uVar1 = 0;
  }
  else {
    secp256k1_scalar_set_b32(&local_38,seckey,&local_3c);
    uVar1 = (uint)(((local_38.d[1] != 0 || local_38.d[3] != 0) ||
                   (local_38.d[0] != 0 || local_38.d[2] != 0)) && local_3c == 0);
  }
  return uVar1;
}

Assistant:

int secp256k1_ec_seckey_verify(const secp256k1_context* ctx, const unsigned char *seckey) {
    secp256k1_scalar sec;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_clear(&sec);
    return ret;
}